

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger_manager.cpp
# Opt level: O0

void __thiscall EmmyDebuggerManager::Eval(EmmyDebuggerManager *this,shared_ptr<EvalContext> *ctx)

{
  bool bVar1;
  element_type *this_00;
  shared_ptr<EvalContext> local_38;
  shared_ptr<Debugger> debugger;
  shared_ptr<EvalContext> *ctx_local;
  EmmyDebuggerManager *this_local;
  
  debugger.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ctx;
  GetHitBreakpoint((EmmyDebuggerManager *)&stack0xffffffffffffffd8);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&stack0xffffffffffffffd8);
  if (bVar1) {
    this_00 = std::__shared_ptr_access<Debugger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Debugger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         &stack0xffffffffffffffd8);
    std::shared_ptr<EvalContext>::shared_ptr(&local_38,ctx);
    Debugger::Eval(this_00,&local_38,false);
    std::shared_ptr<EvalContext>::~shared_ptr(&local_38);
  }
  std::shared_ptr<Debugger>::~shared_ptr((shared_ptr<Debugger> *)&stack0xffffffffffffffd8);
  return;
}

Assistant:

void EmmyDebuggerManager::Eval(std::shared_ptr<EvalContext> ctx)
{
	auto debugger = GetHitBreakpoint();
	if (debugger)
	{
		debugger->Eval(ctx, false);
	}
}